

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viff.cxx
# Opt level: O0

void vigra::map_multiband<unsigned_char,unsigned_short>
               (void_vector<unsigned_short> *dest,uint *dest_bands,void_vector<unsigned_char> *src,
               uint src_bands,uint src_width,uint src_height,void_vector<unsigned_short> *maps,
               uint map_bands,uint map_width,uint map_height)

{
  value_type_conflict3 vVar1;
  value_type_conflict3 *pvVar2;
  colormap<unsigned_char,_unsigned_short> *this;
  uint *in_RSI;
  int in_R8D;
  int in_R9D;
  uint in_stack_00000010;
  uint in_stack_00000018;
  uint i_2;
  uint bandnum_1;
  uint i_1;
  uint bandnum;
  uint band_size;
  uint i;
  colormap_type colormap;
  uint map_band_size;
  uint num_pixels;
  value_type_conflict3 *in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff50;
  undefined2 in_stack_ffffffffffffff54;
  undefined1 in_stack_ffffffffffffff56;
  domain_type in_stack_ffffffffffffff57;
  colormap<unsigned_char,_unsigned_short> *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff68;
  undefined2 in_stack_ffffffffffffff6c;
  undefined2 in_stack_ffffffffffffff6e;
  colormap<unsigned_char,_unsigned_short> *in_stack_ffffffffffffff70;
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_5c;
  
  throw_precondition_error
            (SUB81((ulong)in_stack_ffffffffffffff70 >> 0x38,0),
             (char *)CONCAT26(in_stack_ffffffffffffff6e,
                              CONCAT24(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)),
             in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
  colormap<unsigned_char,_unsigned_short>::colormap
            (in_stack_ffffffffffffff70,CONCAT22(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)
             ,in_stack_ffffffffffffff68,(uint)((ulong)in_stack_ffffffffffffff60 >> 0x20));
  for (local_5c = 0; local_5c < in_stack_00000010; local_5c = local_5c + 1) {
    void_vector<unsigned_short>::data((void_vector<unsigned_short> *)0x1a2c69);
    colormap<unsigned_char,_unsigned_short>::initialize
              (in_stack_ffffffffffffff70,
               (value_type_conflict3 *)
               CONCAT26(in_stack_ffffffffffffff6e,
                        CONCAT24(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)),
               (uint)((ulong)in_stack_ffffffffffffff60 >> 0x20));
  }
  *in_RSI = in_stack_00000010 * in_stack_00000018;
  void_vector<unsigned_short>::resize
            ((void_vector<unsigned_short> *)
             CONCAT17(in_stack_ffffffffffffff57,
                      CONCAT16(in_stack_ffffffffffffff56,
                               CONCAT24(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50))),
             (size_type)in_stack_ffffffffffffff48);
  if (in_stack_00000018 < 2) {
    for (local_7c = 0; local_7c < *in_RSI; local_7c = local_7c + 1) {
      for (local_80 = 0; local_80 < (uint)(in_R8D * in_R9D); local_80 = local_80 + 1) {
        this = (colormap<unsigned_char,_unsigned_short> *)
               void_vector<unsigned_char>::operator[]
                         ((void_vector<unsigned_char> *)
                          CONCAT17(in_stack_ffffffffffffff57,
                                   CONCAT16(in_stack_ffffffffffffff56,
                                            CONCAT24(in_stack_ffffffffffffff54,
                                                     in_stack_ffffffffffffff50))),
                          (size_type)in_stack_ffffffffffffff48);
        vVar1 = colormap<unsigned_char,_unsigned_short>::operator()
                          (this,in_stack_ffffffffffffff57,in_stack_ffffffffffffff50);
        in_stack_ffffffffffffff56 = (undefined1)vVar1;
        in_stack_ffffffffffffff57 = (domain_type)(vVar1 >> 8);
        in_stack_ffffffffffffff48 =
             void_vector<unsigned_short>::operator[]
                       ((void_vector<unsigned_short> *)
                        CONCAT17(in_stack_ffffffffffffff57,
                                 CONCAT16(in_stack_ffffffffffffff56,
                                          CONCAT24(in_stack_ffffffffffffff54,
                                                   in_stack_ffffffffffffff50))),
                        (size_type)in_stack_ffffffffffffff48);
        *in_stack_ffffffffffffff48 = CONCAT11(in_stack_ffffffffffffff57,in_stack_ffffffffffffff56);
      }
    }
  }
  else {
    for (local_74 = 0; local_74 < *in_RSI; local_74 = local_74 + 1) {
      for (local_78 = 0; local_78 < (uint)(in_R8D * in_R9D); local_78 = local_78 + 1) {
        void_vector<unsigned_char>::operator[]
                  ((void_vector<unsigned_char> *)
                   CONCAT17(in_stack_ffffffffffffff57,
                            CONCAT16(in_stack_ffffffffffffff56,
                                     CONCAT24(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)))
                   ,(size_type)in_stack_ffffffffffffff48);
        vVar1 = colormap<unsigned_char,_unsigned_short>::operator()
                          (in_stack_ffffffffffffff58,in_stack_ffffffffffffff57,
                           in_stack_ffffffffffffff50);
        pvVar2 = void_vector<unsigned_short>::operator[]
                           ((void_vector<unsigned_short> *)
                            CONCAT17(in_stack_ffffffffffffff57,
                                     CONCAT16(in_stack_ffffffffffffff56,
                                              CONCAT24(in_stack_ffffffffffffff54,
                                                       in_stack_ffffffffffffff50))),
                            (size_type)in_stack_ffffffffffffff48);
        *pvVar2 = vVar1;
      }
    }
  }
  colormap<unsigned_char,_unsigned_short>::~colormap
            ((colormap<unsigned_char,_unsigned_short> *)0x1a2ebb);
  return;
}

Assistant:

void map_multiband( void_vector<map_storage_type> & dest,
                        unsigned int & dest_bands,
                        const void_vector<storage_type> & src,
                        unsigned int src_bands, unsigned int src_width, unsigned int src_height,
                        const void_vector<map_storage_type> & maps,
                        unsigned int map_bands, unsigned int map_width, unsigned int map_height )
    {
        vigra_precondition(src_bands == 1u,
               "map_multiband(): Source image must have one band.");

        typedef colormap< storage_type, map_storage_type > colormap_type;
        const unsigned int num_pixels = src_width * src_height;

        // build the color map
        const unsigned int map_band_size = map_width * map_height;
        colormap_type colormap( map_height, map_bands, map_width );
        for ( unsigned int i = 0; i < map_bands; ++i )
            colormap.initialize( maps.data() + map_band_size * i, i );

        // map each pixel
        const unsigned int band_size = src_width * src_height;
        dest_bands = map_bands * map_width;
        dest.resize( band_size * dest_bands );
        if ( map_width > 1 ) {
            // interleaved maps => there is only one band in the image
            for( unsigned int bandnum = 0; bandnum < dest_bands; ++bandnum )
                for( unsigned int i = 0; i < num_pixels; ++i )
                    dest[ bandnum * band_size + i ]
                        = colormap( src[i], bandnum );
        } else {
            // non-interleaved bands => map can be used per band
            for( unsigned int bandnum = 0; bandnum < dest_bands; ++bandnum )
                for( unsigned int i = 0; i < num_pixels; ++i )
                    dest[ bandnum * band_size + i ]
                        = colormap( src[ bandnum * band_size + i ], bandnum );
        }
    }